

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O2

void test43(char *infile,char *password,char *outfile,char *xarg)

{
  char *__ptr;
  int iVar1;
  unsigned_long size;
  char *buf;
  
  buf = (char *)0x0;
  size = 0;
  read_file_into_memory(infile,&buf,&size);
  __ptr = buf;
  iVar1 = qpdf_create_from_json_data(qpdf,buf,size);
  if (iVar1 == 0) {
    qpdf_init_write(qpdf,outfile);
    qpdf_set_static_ID(qpdf,1);
    qpdf_write(qpdf);
    report_errors();
    free(__ptr);
    return;
  }
  __assert_fail("qpdf_create_from_json_data(qpdf, buf, size) == QPDF_SUCCESS",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                ,0x4f4,"void test43(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test43(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    char* buf = NULL;
    unsigned long size = 0;
    read_file_into_memory(infile, &buf, &size);
    assert(qpdf_create_from_json_data(qpdf, buf, size) == QPDF_SUCCESS);
    qpdf_init_write(qpdf, outfile);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_write(qpdf);
    report_errors();
    free(buf);
}